

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

void __thiscall helics::apps::Echo::Echo(Echo *this,int argc,char **argv)

{
  undefined8 *in_RDI;
  char **in_stack_000001c0;
  int in_stack_000001cc;
  App *in_stack_000001d0;
  undefined1 in_stack_000001d8 [16];
  Echo *in_stack_00000480;
  Echo *this_00;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  App::App(in_stack_000001d0,(string_view)in_stack_000001d8,in_stack_000001cc,in_stack_000001c0);
  *in_RDI = &PTR__Echo_00a47320;
  this_00 = (Echo *)(in_RDI + 0x14);
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x40562b);
  in_RDI[0x1e] = 0;
  in_RDI[0x1f] = 0;
  std::mutex::mutex((mutex *)0x405653);
  processArgs(in_stack_00000480);
  initialSetup(this_00);
  return;
}

Assistant:

Echo::Echo(int argc, char* argv[]): App("echo", argc, argv)
    {
        processArgs();
        initialSetup();
    }